

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Node parse_subexpr(Parser *psr,Precedence minimum)

{
  uint64_t uVar1;
  BcIns *pBVar2;
  Node *node;
  undefined4 uVar3;
  byte bVar4;
  byte bVar5;
  undefined1 uVar6;
  NodeType NVar7;
  int iVar8;
  Precedence minimum_00;
  undefined4 uVar9;
  BcOp BVar10;
  uint uVar11;
  ulong uVar12;
  Precedence PVar13;
  Node *node_00;
  long lVar14;
  Lexer *pLVar15;
  bool bVar16;
  anon_union_8_6_f630ca3c_for_Node_1 aVar17;
  Node NVar18;
  Node NVar19;
  Node left;
  Node local_78;
  Node local_68;
  undefined1 local_58 [28];
  Precedence local_3c;
  Lexer *local_38;
  
  iVar8 = (psr->lxr).tk.type;
  if (iVar8 < 0x113) {
    if (iVar8 != 0x21) {
      if (iVar8 == 0x28) {
        pLVar15 = &psr->lxr;
        lex_next(pLVar15);
        NVar18 = parse_subexpr(psr,PREC_NONE);
        aVar17 = NVar18.field_1;
        NVar7 = NVar18.type;
        lex_expect(pLVar15,0x29);
        lex_next(pLVar15);
        local_58._8_8_ = aVar17;
        goto LAB_00111cef;
      }
      if (iVar8 != 0x2d) goto switchD_00111b25_default;
    }
    lex_next(&psr->lxr);
    NVar18 = parse_subexpr(psr,PREC_UNARY);
    local_58._8_8_ = NVar18.field_1;
    local_58._0_4_ = NVar18.type;
    if (iVar8 == 0x21) {
      expr_to_jmp(psr,(Node *)local_58);
      uVar3 = local_58._12_4_;
      aVar17.jmp.false_list = 0;
      aVar17.prim = local_58._12_4_;
      local_58._12_4_ = local_58._8_4_;
      local_58._8_4_ = uVar3;
      NVar7 = local_58._0_4_;
    }
    else {
      if (iVar8 != 0x2d) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                      ,0x432,"void expr_emit_unary(Parser *, Tk, Node *)");
      }
      if (local_58._0_4_ == NODE_NUM) {
        aVar17 = (anon_union_8_6_f630ca3c_for_Node_1)(local_58._8_8_ ^ (ulong)DAT_00139760);
        NVar7 = NODE_NUM;
        local_58._8_8_ = aVar17;
      }
      else {
        if (local_58._0_4_ == NODE_PRIM) {
          psr_trigger_err(psr,"invalid operand to unary operator");
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                        ,0x40e,"void expr_emit_neg(Parser *, Node *)");
        }
        expr_discharge(psr,(Node *)local_58);
        if (local_58._0_4_ == NODE_NON_RELOC) {
          uVar6 = local_58[8];
        }
        else {
          uVar6 = expr_to_next_slot(psr,(Node *)local_58);
        }
        expr_free_node(psr,(Node *)local_58);
        uVar11 = fn_emit(psr->vm->fns + psr->scope->fn,(uint)(byte)uVar6 << 0x10 | 0xe);
        aVar17.jmp.false_list = 0;
        aVar17.reloc_idx = uVar11;
        local_58._8_4_ = uVar11;
        NVar7 = NODE_RELOC;
      }
    }
  }
  else {
    switch(iVar8) {
    case 0x113:
      lex_next(&psr->lxr);
      iVar8 = parse_fn_args_body(psr);
      uVar11 = fn_emit(psr->vm->fns + psr->scope->fn,iVar8 * 0x10000 + 3);
      aVar17.jmp.false_list = 0;
      aVar17.reloc_idx = uVar11;
      NVar7 = NODE_RELOC;
      local_58._8_8_ = aVar17;
      break;
    case 0x114:
      uVar1 = (psr->lxr).tk.field_4.ident_hash;
      lex_next(&psr->lxr);
      iVar8 = psr->scope->first_local;
      if (iVar8 < psr->locals_count) {
        uVar12 = 0;
        do {
          if (psr->locals[(long)iVar8 + uVar12].name == uVar1) {
            if ((int)uVar12 != -1) {
              aVar17 = (anon_union_8_6_f630ca3c_for_Node_1)(uVar12 & 0xff);
              NVar7 = NODE_LOCAL;
              local_58._8_8_ = aVar17;
              goto LAB_00111cef;
            }
            break;
          }
          uVar12 = uVar12 + 1;
        } while ((long)psr->locals_count - (long)iVar8 != uVar12);
      }
      psr_trigger_err(psr,"variable not defined");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x4a2,"Node expr_operand_name(Parser *)");
    case 0x115:
      aVar17 = (anon_union_8_6_f630ca3c_for_Node_1)(psr->lxr).tk.field_4.ident_hash;
      lex_next(&psr->lxr);
      NVar7 = NODE_NUM;
      local_58._8_8_ = aVar17;
      break;
    case 0x116:
    case 0x117:
    case 0x118:
      aVar17.prim = iVar8 - 0x116;
      aVar17.jmp.false_list = 0;
      lex_next(&psr->lxr);
      NVar7 = NODE_PRIM;
      local_58._8_8_ = aVar17;
      break;
    default:
switchD_00111b25_default:
      psr_trigger_err(psr,"expected expression");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x4de,"Node expr_operand(Parser *)");
    }
  }
LAB_00111cef:
  uVar11 = (psr->lxr).tk.type;
  local_3c = minimum;
  if (uVar11 == 0x28) {
    if (NVar7 != NODE_LOCAL) {
      psr_trigger_err(psr,"cannot call non-local type");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x43b,"void expr_postfix_fn_call(Parser *, Node *)");
    }
    pLVar15 = &psr->lxr;
    lex_next(pLVar15);
    uVar11 = psr->scope->next_slot;
    if ((psr->lxr).tk.type != 0x29) {
      do {
        NVar18 = parse_subexpr(psr,PREC_NONE);
        local_68.field_1 = NVar18.field_1;
        local_68.type = NVar18.type;
        expr_to_next_slot(psr,&local_68);
        iVar8 = (psr->lxr).tk.type;
        if (iVar8 == 0x2c) {
          lex_next(pLVar15);
          iVar8 = (psr->lxr).tk.type;
        }
      } while (iVar8 != 0x29);
    }
    lex_next(pLVar15);
    fn_emit(psr->vm->fns + psr->scope->fn,
            (psr->scope->next_slot - uVar11) * 0x1000000 +
            ((uVar11 & 0xff) << 0x10 | (aVar17.prim & 0xff) << 8) + 0x1f);
    local_58[8] = (char)uVar11;
    psr->scope->next_slot = (uVar11 & 0xff) + 1;
    uVar11 = (psr->lxr).tk.type;
    NVar7 = NODE_NON_RELOC;
  }
  PVar13 = local_3c;
  aVar17 = (anon_union_8_6_f630ca3c_for_Node_1)local_58._8_8_;
  local_78.field_1 = (anon_union_8_6_f630ca3c_for_Node_1)local_58._8_8_;
  local_78.type = NVar7;
  minimum_00 = binop_prec(uVar11);
  if (minimum_00 <= PVar13) {
LAB_001122f6:
    NVar19._4_4_ = 0;
    NVar19.type = NVar7;
    NVar19.field_1 = aVar17;
    return NVar19;
  }
  pLVar15 = &psr->lxr;
  local_38 = pLVar15;
LAB_00111def:
  lex_next(pLVar15);
  uVar12 = (ulong)uVar11;
  if (uVar11 < 0x3f) {
    if ((0xac0000000000U >> (uVar12 & 0x3f) & 1) == 0) {
      if ((0x5000000000000000U >> (uVar12 & 0x3f) & 1) == 0) goto LAB_00111e31;
      goto LAB_00111e41;
    }
    if (local_78.type == NODE_NUM) goto LAB_00111e6c;
    if (local_78.type == NODE_PRIM) {
      psr_trigger_err(psr,"invalid operand to binary operator");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x3ef,"void expr_emit_binary_left(Parser *, Tk, Node *)");
    }
LAB_00111e61:
    expr_to_ins_arg(psr,&local_78);
  }
  else {
LAB_00111e31:
    if (uVar11 - 0x106 < 4) {
LAB_00111e41:
      if (local_78.type != NODE_NUM) {
        if ((((uVar11 - 0x106 < 4) || (uVar11 == 0x3e)) || (uVar11 == 0x3c)) &&
           (local_78.type == NODE_PRIM)) {
          psr_trigger_err(psr,"invalid operand to binary operator");
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                        ,0x3f9,"void expr_emit_binary_left(Parser *, Tk, Node *)");
        }
        goto LAB_00111e61;
      }
    }
    else {
      if ((uVar11 & 0xfffffffe) != 0x10a) goto LAB_00111e61;
      expr_to_jmp(psr,&local_78);
    }
  }
LAB_00111e6c:
  NVar18 = parse_subexpr(psr,minimum_00);
  aVar17 = NVar18.field_1;
  NVar7 = NVar18.type;
  if (0x3e < uVar11) {
code_r0x00111e90:
    switch(uVar11) {
    case 0x106:
    case 0x107:
      goto switchD_00111e9e_caseD_106;
    case 0x108:
    case 0x109:
      goto switchD_00111e9e_caseD_108;
    case 0x10a:
      local_68.type = NVar7;
      local_68.field_1 = aVar17;
      expr_to_jmp(psr,&local_68);
      jmp_ensure_true_falls_through(psr,&local_78);
      uVar3 = local_78.field_1.jmp.false_list;
      jmp_list_patch(psr,local_78.field_1.reloc_idx,local_78.field_1.jmp.false_list + 1);
      local_78.field_1.prim = local_68.field_1.prim;
      iVar8 = jmp_list_merge(psr,uVar3,local_68.field_1.jmp.false_list);
      local_78.field_1.jmp.false_list = iVar8;
      goto LAB_001122d6;
    case 0x10b:
      local_68.type = NVar7;
      local_68.field_1 = aVar17;
      expr_to_jmp(psr,&local_68);
      aVar17 = local_78.field_1;
      uVar3 = local_78.field_1.jmp.false_list;
      uVar12 = (ulong)(uint)local_78.field_1.jmp.false_list;
      uVar9 = local_78.field_1.prim;
      if (local_78.field_1.reloc_idx < local_78.field_1.jmp.false_list) {
        lVar14 = (long)local_78.field_1.jmp.false_list;
        pBVar2 = psr->vm->fns[psr->scope->fn].ins;
        BVar10 = relop_invert((uint)(byte)pBVar2[lVar14 + -1]);
        pBVar2[lVar14 + -1] = pBVar2[lVar14 + -1] & 0xffffff00 | BVar10;
        uVar9 = uVar3;
        if (-1 < (long)aVar17) {
          uVar9 = ((psr->vm->fns[psr->scope->fn].ins[uVar12] >> 8) + uVar3) - 0x7fffff;
        }
        local_78.field_1.jmp.false_list = uVar9;
        jmp_list_append(psr,&local_78.field_1.reloc_idx,uVar3);
        uVar9 = local_78.field_1.prim;
      }
      jmp_list_patch(psr,local_78.field_1.jmp.false_list,uVar9 + 1);
      local_78.field_1.jmp.false_list = local_68.field_1.jmp.false_list;
      uVar11 = jmp_list_merge(psr,uVar9,local_68.field_1.reloc_idx);
      goto LAB_001122d2;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x3de,"void expr_emit_binary(Parser *, Tk, Node *, Node)");
    }
  }
  if ((0xac0000000000U >> (uVar12 & 0x3f) & 1) == 0) {
    if ((0x5000000000000000U >> (uVar12 & 0x3f) & 1) == 0) goto code_r0x00111e90;
    goto switchD_00111e9e_caseD_108;
  }
  NVar18._0_8_ = NVar18._0_8_ & 0xffffffff;
  NVar18.field_1.num = aVar17.num;
  expr_emit_arith(psr,uVar11,&local_78,NVar18);
  goto LAB_001122d6;
switchD_00111e9e_caseD_108:
  if (NVar7 == NODE_PRIM) {
    psr_trigger_err(psr,"invalid operand to binary operator");
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                  ,0x35d,"void expr_emit_rel(Parser *, Tk, Node *, Node)");
  }
switchD_00111e9e_caseD_106:
  if (local_78.type != NVar7) {
LAB_00111f7d:
    if ((local_78.type < NODE_RELOC) && (local_78.type != NODE_LOCAL)) {
      if ((int)uVar11 < 0x106) {
        if (uVar11 == 0x3c) {
          uVar11 = 0x109;
        }
        else {
          if (uVar11 != 0x3e) {
LAB_00112470:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                          ,0x14c,"Tk binop_invert_rel(Tk)");
          }
          uVar11 = 0x108;
        }
      }
      else if (1 < uVar11 - 0x106) {
        if (uVar11 == 0x108) {
          uVar11 = 0x3e;
        }
        else {
          if (uVar11 != 0x109) goto LAB_00112470;
          uVar11 = 0x3c;
        }
      }
      local_68.type = NVar7;
      local_58._4_4_ = local_78._4_4_;
      local_58._0_4_ = local_78.type;
      local_58._8_8_ = local_78.field_1;
      local_68.field_1 = aVar17;
    }
    else {
      local_68._4_4_ = local_78._4_4_;
      local_68.type = local_78.type;
      local_68.field_1.num = local_78.field_1.num;
      local_58._0_4_ = NVar7;
      local_58._8_8_ = aVar17;
    }
    bVar4 = expr_to_ins_arg(psr,&local_68);
    bVar5 = expr_to_ins_arg(psr,(Node *)local_58);
    node_00 = &local_68;
    node = (Node *)local_58;
    if (bVar5 < bVar4) {
      node_00 = (Node *)local_58;
      node = &local_68;
    }
    expr_free_node(psr,node);
    expr_free_node(psr,node_00);
    pLVar15 = local_38;
    if (local_58._0_4_ == NODE_PRIM) {
      iVar8 = 2;
    }
    else {
      iVar8 = 0;
      if (local_58._0_4_ != NODE_NON_RELOC) {
        if (local_58._0_4_ != NODE_CONST) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                        ,0x388,"void expr_emit_rel(Parser *, Tk, Node *, Node)");
        }
        iVar8 = 1;
      }
    }
    BVar10 = binop_opcode(uVar11);
    fn_emit(psr->vm->fns + psr->scope->fn,(uint)bVar5 << 0x10 | (uint)bVar4 << 8 | iVar8 + BVar10);
    local_78.field_1.reloc_idx = fn_emit(psr->vm->fns + psr->scope->fn,0x1d);
    pBVar2 = psr->vm->fns[psr->scope->fn].ins;
    pBVar2[local_78.field_1.reloc_idx] =
         ~local_78.field_1.prim * 0x100 + (uint)(byte)pBVar2[local_78.field_1.reloc_idx] +
         0x7fffff00;
    local_78.type = NODE_JMP;
    local_78.field_1.jmp.false_list = -1;
    PVar13 = local_3c;
    goto LAB_001122d6;
  }
  if (NVar7 == NODE_PRIM) {
    if (uVar11 == 0x107) {
      bVar16 = local_78.field_1.prim != NVar18.field_1._0_4_;
    }
    else {
      if (uVar11 != 0x106) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                      ,0x34b,"_Bool expr_fold_rel(Tk, Node *, Node)");
      }
      bVar16 = local_78.field_1.prim == NVar18.field_1._0_4_;
    }
    goto LAB_001122c5;
  }
  if (NVar7 != NODE_NUM) goto LAB_00111f7d;
  switch(uVar11) {
  case 0x106:
    bVar16 = aVar17.num == local_78.field_1.num;
    break;
  case 0x107:
    bVar16 = aVar17.num != local_78.field_1.num;
    break;
  case 0x108:
    bVar16 = aVar17.num < local_78.field_1.num;
    goto LAB_001122b1;
  case 0x109:
    bVar16 = local_78.field_1.num < aVar17.num;
LAB_001122b1:
    bVar16 = !bVar16;
    goto LAB_001122c5;
  default:
    if (uVar11 == 0x3c) {
      bVar16 = aVar17.num < local_78.field_1.num;
    }
    else {
      if (uVar11 != 0x3e) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                      ,0x33e,"_Bool expr_fold_rel(Tk, Node *, Node)");
      }
      bVar16 = local_78.field_1.num < aVar17.num;
    }
    bVar16 = !bVar16 && local_78.field_1.num != aVar17.num;
    goto LAB_001122c5;
  }
  bVar16 = (bool)(-bVar16 & 1);
LAB_001122c5:
  local_78.type = NODE_PRIM;
  uVar11 = bVar16 | 2;
LAB_001122d2:
  local_78.field_1.prim = uVar11;
LAB_001122d6:
  uVar11 = (psr->lxr).tk.type;
  minimum_00 = binop_prec(uVar11);
  aVar17 = local_78.field_1;
  NVar7 = local_78.type;
  if (minimum_00 <= PVar13) goto LAB_001122f6;
  goto LAB_00111def;
}

Assistant:

static Node parse_subexpr(Parser *psr, Precedence minimum) {
	// Parse the left operand to the binary operation
	Node left = expr_unary(psr);

	// Keep parsing binary operators until we encounter one with a precedence
	// less than the minimum
	// We need the explicit cast to an int, or else it tries to convert -1
	// returned by `binop_prec` into an unsigned value
	while (binop_prec(psr->lxr.tk.type) > minimum) {
		// Skip the binary operator token
		Tk binop = psr->lxr.tk.type;
		lex_next(&psr->lxr);

		// Some binary operations require us to emit code for the left operand
		// BEFORE we parse the right one
		expr_emit_binary_left(psr, binop, &left);

		// Parse the right operand to the binary operator
		Node right = parse_subexpr(psr, binop_prec(binop));

		// Emit bytecode for the whole binary operation
		expr_emit_binary(psr, binop, &left, right);
	}
	return left;
}